

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WordEmbedding.pb.cc
# Opt level: O2

void __thiscall CoreML::Specification::CoreMLModels::WordEmbedding::Clear(WordEmbedding *this)

{
  google::protobuf::internal::ArenaStringPtr::ClearToEmpty(&this->language_);
  google::protobuf::internal::ArenaStringPtr::ClearToEmpty(&this->modelparameterdata_);
  this->revision_ = 0;
  google::protobuf::internal::InternalMetadata::Clear<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_);
  return;
}

Assistant:

void WordEmbedding::Clear() {
// @@protoc_insertion_point(message_clear_start:CoreML.Specification.CoreMLModels.WordEmbedding)
  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  language_.ClearToEmpty();
  modelparameterdata_.ClearToEmpty();
  revision_ = 0u;
  _internal_metadata_.Clear<std::string>();
}